

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

bool __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::PopLM(Geobucket<4UL> *this,MM<6UL> *lm)

{
  undefined1 *this_00;
  size_t *psVar1;
  pointer pMVar2;
  void *pvVar3;
  int iVar4;
  pointer pMVar5;
  long lVar6;
  long lVar7;
  
  pMVar5 = (this->_buckets).
           super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->_buckets).
                super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 5;
  this_00 = &pMVar5->field_0x18;
  lVar7 = -1;
  do {
    while (lVar6 = lVar6 + -1,
          pMVar5[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
          super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size ==
          0) {
LAB_001354ee:
      if (lVar6 == 0) {
        if (lVar7 == -1) {
          return false;
        }
        pMVar5 = (this->_buckets).
                 super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = *(void **)&pMVar5[lVar7].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                            super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
        psVar1 = (size_t *)
                 ((long)&pMVar5[lVar7].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                         super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10);
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pvVar3,0x18);
        return true;
      }
      pMVar5 = (this->_buckets).
               super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar7 == -1) {
LAB_001354e0:
      (lm->super_WW<6UL>)._words[0] =
           (word)pMVar5[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                 super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
      lVar7 = lVar6;
      goto LAB_001354ee;
    }
    iVar4 = MOGrevlex<6UL>::Compare
                      ((MOGrevlex<6UL> *)this_00,
                       (MM<6UL> *)
                       (pMVar5[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                        super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl.
                        _M_node.super__List_node_base._M_next + 1),lm);
    if (0 < iVar4) {
      pMVar5 = (this->_buckets).
               super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001354e0;
    }
    if (iVar4 != 0) goto LAB_001354ee;
    pMVar5 = (this->_buckets).
             super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = *(void **)&pMVar5[lVar7].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                        super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
    psVar1 = (size_t *)
             ((long)&pMVar5[lVar7].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                     super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10);
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar3,0x18);
    pMVar5 = (this->_buckets).
             super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = *(void **)&pMVar5[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                        super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
    psVar1 = (size_t *)
             ((long)&pMVar5[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                     super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10);
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar3,0x18);
    pMVar5 = (this->_buckets).
             super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (this->_buckets).
             super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)pMVar2 - (long)pMVar5 >> 5;
    lVar7 = -1;
    if (pMVar2 == pMVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool PopLM(MM<_n>& lm)
		{
			int cmp;
			size_t i = SIZE_MAX, j = (size_t)_buckets.size();
			const _O& o = _buckets[0].GetOrder();
			do
			{
				// пропускаем пустые корзины
				if (_buckets[--j].IsEmpty())
					continue;
				// новый старший моном?
				if (i == SIZE_MAX || (cmp = o.Compare(_buckets[j].LM(), lm)) > 0)
					lm = _buckets[i = j].LM();
				// одинаковые мономы?
				else if (cmp == 0) 
				{
					// удаляем мономы из корзин и начинаем все сначала
					_buckets[i].PopLM(), _buckets[j].PopLM();
					i = SIZE_MAX, j = (size_t)_buckets.size();
				}
			}
			while (j != 0);
			// моногочлен ненулевой?
			if (i != SIZE_MAX) _buckets[i].PopLM();
			// признак успеха
			return i != SIZE_MAX;
		}